

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void greet_prog_tower_shopkeeper(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI
  ;
  CHAR_DATA *in_RDI;
  string *unaff_retaddr;
  int in_stack_0000000c;
  CQueue *in_stack_00000010;
  char (*in_stack_00000020) [1];
  char_data **in_stack_00000048;
  _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *in_stack_00000050;
  string *in_stack_00000058;
  string *in_stack_00000060;
  int in_stack_0000006c;
  CQueue *in_stack_00000070;
  char (*in_stack_00000080) [90];
  AFFECT_DATA af;
  CHAR_DATA *in_stack_fffffffffffffe98;
  CHAR_DATA *in_stack_fffffffffffffea0;
  CHAR_DATA *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [55];
  allocator<char> local_99;
  string local_98 [58];
  undefined2 local_5e;
  short local_5c;
  undefined2 local_58;
  char_data **in_stack_ffffffffffffffe8;
  
  bVar1 = is_affected(in_RDI,(int)gsn_bash);
  if ((!bVar1) && (bVar1 = is_npc(in_stack_fffffffffffffe98), !bVar1)) {
    init_affect((AFFECT_DATA *)0x680a73);
    local_5e = 0;
    local_5c = gsn_bash;
    local_58 = 0xffff;
    affect_to_char(in_stack_fffffffffffffea0,(AFFECT_DATA *)in_stack_fffffffffffffe98);
    act(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
        in_stack_fffffffffffffe98,0);
    act(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
        in_stack_fffffffffffffe98,0);
    __a = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,__a);
    CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[90]>
              (in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058,
               in_stack_00000050,in_stack_00000048,in_stack_00000080);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,__a);
    CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[1]>
              (in_stack_00000010,in_stack_0000000c,unaff_retaddr,(string *)in_RDI,in_RSI,
               in_stack_ffffffffffffffe8,in_stack_00000020);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  return;
}

Assistant:

void greet_prog_tower_shopkeeper(CHAR_DATA *mob, CHAR_DATA *ch)
{
	AFFECT_DATA af;

	if (is_affected(mob, gsn_bash))
		return;

	if (is_npc(ch))
		return;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_bash;
	af.duration = -1;

	affect_to_char(mob, &af);

	act("$N glances over his shoulder at $n and grumbles.", ch, 0, mob, TO_ROOM);
	act("$n glances over his shoulder at you and grumbles.", mob, 0, ch, TO_VICT);
	RS.Queue.AddToQueue(4, "greet_prog_tower_shopkeeper", "do_say_queue", do_say_queue, mob, "Well,  are ye goin' to buy somethin' or are ye just going t'stand there and stare at me!?");
	RS.Queue.AddToQueue(24, "greet_prog_tower_shopkeeper", "do_astrip_queue", do_astrip_queue, mob, "");
}